

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O1

bool __thiscall
EnvironmentNAVXYTHETAMLEVLAT::IsObstacle(EnvironmentNAVXYTHETAMLEVLAT *this,int X,int Y)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  
  bVar1 = EnvironmentNAVXYTHETALATTICE::IsObstacle((EnvironmentNAVXYTHETALATTICE *)this,X,Y);
  bVar3 = true;
  if (!bVar1) {
    if ((long)this->numofadditionalzlevs < 1) {
      bVar3 = false;
    }
    else {
      lVar2 = 0;
      do {
        bVar3 = (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                EnvNAVXYTHETALATCfg.obsthresh <= this->AddLevelGrid2D[lVar2][X][Y];
        if (bVar3) {
          return bVar3;
        }
        bVar1 = (long)this->numofadditionalzlevs + -1 != lVar2;
        lVar2 = lVar2 + 1;
      } while (bVar1);
    }
  }
  return bVar3;
}

Assistant:

bool EnvironmentNAVXYTHETAMLEVLAT::IsObstacle(int X, int Y)
{
    int levelind;

    if (EnvironmentNAVXYTHETALAT::IsObstacle(X, Y)) return true;

    //iterate through the additional levels
    for (levelind = 0; levelind < numofadditionalzlevs; levelind++) {
        if (AddLevelGrid2D[levelind][X][Y] >= EnvNAVXYTHETALATCfg.obsthresh) return true;
    }
    //otherwise the cell is obstacle-free at all cells
    return false;
}